

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_int32(ma_dr_flac_bs *bs,uint bitCount,ma_int32 *pResult)

{
  ulong uVar1;
  bool bVar2;
  ma_bool32 mVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  
  bVar5 = (byte)bitCount;
  uVar7 = bitCount;
  if (bs->consumedBits == 0x40) {
    mVar3 = ma_dr_flac__reload_cache(bs);
    if (mVar3 == 0) {
      bVar2 = true;
      goto LAB_0018a320;
    }
  }
  uVar8 = 0x40 - (ulong)bs->consumedBits;
  if (uVar8 < bitCount) {
    uVar1 = bs->cache;
    mVar3 = ma_dr_flac__reload_cache(bs);
    bVar2 = true;
    if (mVar3 == 0) goto LAB_0018a320;
    uVar4 = bitCount - (int)uVar8;
    if (0x40 - (ulong)bs->consumedBits < (ulong)uVar4) goto LAB_0018a320;
    bVar6 = (byte)uVar4;
    uVar7 = (uint)((~(0xffffffffffffffffU >> (bVar6 & 0x3f)) & bs->cache) >> (-bVar6 & 0x3f)) |
            (int)((~(0xffffffffffffffffU >> ((byte)uVar8 & 0x3f)) & uVar1) >> (-(byte)uVar8 & 0x3f))
            << (bVar6 & 0x1f);
    bs->consumedBits = bs->consumedBits + uVar4;
    bs->cache = bs->cache << (bVar6 & 0x3f);
  }
  else {
    uVar7 = (uint)((~(0xffffffffffffffffU >> (bVar5 & 0x3f)) & bs->cache) >> (-bVar5 & 0x3f));
    bs->consumedBits = bs->consumedBits + bitCount;
    bs->cache = bs->cache << (bVar5 & 0x3f);
  }
  bVar2 = false;
LAB_0018a320:
  mVar3 = 0;
  if (!bVar2) {
    if (bitCount < 0x20) {
      uVar7 = -(uint)((uVar7 >> (bitCount - 1 & 0x1f) & 1) != 0) << (bVar5 & 0x1f) | uVar7;
    }
    *pResult = uVar7;
    mVar3 = 1;
  }
  return mVar3;
}

Assistant:

static ma_bool32 ma_dr_flac__read_int32(ma_dr_flac_bs* bs, unsigned int bitCount, ma_int32* pResult)
{
    ma_uint32 result;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(pResult != NULL);
    MA_DR_FLAC_ASSERT(bitCount > 0);
    MA_DR_FLAC_ASSERT(bitCount <= 32);
    if (!ma_dr_flac__read_uint32(bs, bitCount, &result)) {
        return MA_FALSE;
    }
    if (bitCount < 32) {
        ma_uint32 signbit;
        signbit = ((result >> (bitCount-1)) & 0x01);
        result |= (~signbit + 1) << bitCount;
    }
    *pResult = (ma_int32)result;
    return MA_TRUE;
}